

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O2

void parse_filename(string *file_name,string *part_name,bool *force_part_name,int *part_num)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  invalid_argument *this;
  string num;
  string local_50 [32];
  
  *force_part_name = false;
  std::__cxx11::string::_M_assign((string *)part_name);
  lVar1 = std::__cxx11::string::rfind((char *)file_name,0x10b05e);
  if (lVar1 == -1) {
    parse_partname(part_name);
  }
  else {
    std::__cxx11::string::substr((ulong)&num,(ulong)file_name);
    std::__cxx11::string::operator=((string *)part_name,(string *)&num);
    std::__cxx11::string::~string((string *)&num);
    std::__cxx11::string::substr((ulong)&num,(ulong)file_name);
    std::__cxx11::string::operator=((string *)file_name,(string *)&num);
    std::__cxx11::string::~string((string *)&num);
    *force_part_name = true;
  }
  lVar1 = std::__cxx11::string::rfind((char)file_name,0x3a);
  if (lVar1 == -1) {
    *part_num = -1;
  }
  else {
    std::__cxx11::string::substr((ulong)&num,(ulong)file_name);
    bVar2 = is_number(&num);
    if (!bVar2) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"part number must be a number");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    iVar3 = atoi(num._M_dataplus._M_p);
    *part_num = iVar3;
    std::__cxx11::string::substr((ulong)local_50,(ulong)file_name);
    std::__cxx11::string::operator=((string *)file_name,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&num);
  }
  return;
}

Assistant:

void
parse_filename (
    string& file_name, string& part_name, bool& force_part_name, int& part_num)
{
    force_part_name    = false;
    part_name          = file_name; // default is the file_name
    size_t doublecolon = file_name.rfind ("::");
    if (doublecolon != string::npos)
    {
        part_name       = file_name.substr (doublecolon + 2);
        file_name       = file_name.substr (0, doublecolon);
        force_part_name = true;
    }
    else
    {
        parse_partname (part_name);
    }

    size_t colon = file_name.rfind (':');
    if (colon == string::npos)
    {
        part_num = -1; // use all parts
    }
    else
    {
        string num = file_name.substr (colon + 1);
        if (is_number (num))
        {
            part_num  = atoi (num.c_str ());
            file_name = file_name.substr (0, colon);
        }
        else
        {
            throw invalid_argument("part number must be a number");
    }
    }
}